

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

void __thiscall
ipx::Model::CorrectScaledBasicSolution
          (Model *this,Vector *x,Vector *slack,Vector *y,Vector *z,
          vector<int,_std::allocator<int>_> *cbasis,vector<int,_std::allocator<int>_> *vbasis)

{
  double dVar1;
  const_reference pvVar2;
  double *pdVar3;
  valarray<double> *in_RCX;
  valarray<double> *in_RDX;
  valarray<double> *in_RSI;
  long in_RDI;
  valarray<double> *in_R8;
  vector<int,_std::allocator<int>_> *in_R9;
  vector<int,_std::allocator<int>_> *in_stack_00000008;
  Int i;
  Int j;
  undefined4 local_38;
  undefined4 local_34;
  
  for (local_34 = 0; local_34 < *(int *)(in_RDI + 0x170); local_34 = local_34 + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](in_stack_00000008,(long)local_34);
    if (*pvVar2 == -1) {
      pdVar3 = std::valarray<double>::operator[]
                         ((valarray<double> *)(in_RDI + 0x1e8),(long)local_34);
      dVar1 = *pdVar3;
      pdVar3 = std::valarray<double>::operator[](in_RSI,(long)local_34);
      *pdVar3 = dVar1;
    }
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](in_stack_00000008,(long)local_34);
    if (*pvVar2 == -2) {
      pdVar3 = std::valarray<double>::operator[]
                         ((valarray<double> *)(in_RDI + 0x1f8),(long)local_34);
      dVar1 = *pdVar3;
      pdVar3 = std::valarray<double>::operator[](in_RSI,(long)local_34);
      *pdVar3 = dVar1;
    }
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](in_stack_00000008,(long)local_34);
    if (*pvVar2 == 0) {
      pdVar3 = std::valarray<double>::operator[](in_R8,(long)local_34);
      *pdVar3 = 0.0;
    }
  }
  for (local_38 = 0; local_38 < *(int *)(in_RDI + 0x168); local_38 = local_38 + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](in_R9,(long)local_38);
    if (*pvVar2 == -1) {
      pdVar3 = std::valarray<double>::operator[](in_RDX,(long)local_38);
      *pdVar3 = 0.0;
    }
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](in_R9,(long)local_38);
    if (*pvVar2 == 0) {
      pdVar3 = std::valarray<double>::operator[](in_RCX,(long)local_38);
      *pdVar3 = 0.0;
    }
  }
  return;
}

Assistant:

void Model::CorrectScaledBasicSolution(Vector& x, Vector& slack, Vector& y,
                                       Vector& z,
                                       const std::vector<Int> cbasis,
                                       const std::vector<Int> vbasis) const {
    for (Int j = 0; j < num_var_; j++) {
        if (vbasis[j] == IPX_nonbasic_lb)
            x[j] = scaled_lbuser_[j];
        if (vbasis[j] == IPX_nonbasic_ub)
            x[j] = scaled_ubuser_[j];
        if (vbasis[j] == IPX_basic)
            z[j] = 0.0;
    }
    for (Int i = 0; i < num_constr_; i++) {
        if (cbasis[i] == IPX_nonbasic)
            slack[i] = 0.0;
        if (cbasis[i] == IPX_basic)
            y[i] = 0.0;
    }
}